

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.cpp
# Opt level: O2

void __thiscall jessilib::impl::timer_manager::loop(timer_manager *this)

{
  const_iterator __position;
  cv_status cVar1;
  time_point_t tVar2;
  timer_context *context;
  _Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
  *local_90;
  __weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2> local_88;
  weak_ptr<jessilib::impl::timer_context> weak_context;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  mutex *local_48;
  unique_lock<std::mutex> lock;
  
  local_48 = &this->m_mutex;
  local_90 = (_Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
              *)&this->m_active_timers;
  while (((this->m_thread_active)._M_base._M_i & 1U) != 0) {
    std::unique_lock<std::mutex>::unique_lock(&lock,local_48);
    __position._M_node =
         (this->m_active_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->m_active_timers)._M_t._M_impl.super__Rb_tree_header) {
      std::condition_variable::wait((unique_lock *)&this->m_cvar);
    }
    else {
      weak_context.super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)timer_context::next(*(timer_context **)(__position._M_node + 1));
      cVar1 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->m_cvar,&lock,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&weak_context);
      if (((cVar1 == timeout) &&
          ((this->m_active_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
         (__position._M_node ==
          (this->m_active_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)) {
        if (this->is_timeout == false) {
          this->is_timeout = true;
        }
        else {
          context = *(timer_context **)(__position._M_node + 1);
          std::
          _Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
          ::erase_abi_cxx11_(local_90,__position);
          tVar2 = timer_context::calc_next(context);
          (context->m_next).__d.__r = (rep)tVar2.__d.__r;
          std::
          _Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
          ::_M_insert_equal<jessilib::impl::timer_context*const&>(local_90,&context);
          std::__weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                    (&weak_context.
                      super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>,
                     (__weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2> *)
                     context);
          std::__weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                    (&local_88,
                     &weak_context.
                      super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>);
          local_58 = (code *)0x0;
          pcStack_50 = (code *)0x0;
          local_68._M_unused._M_object = (void *)0x0;
          local_68._8_8_ = 0;
          local_68._M_unused._M_object = operator_new(0x10);
          *(element_type **)local_68._M_unused._0_8_ = local_88._M_ptr;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 8) =
               local_88._M_refcount._M_pi;
          local_88._M_ptr = (element_type *)0x0;
          local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pcStack_50 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer_manager.cpp:68:17)>
                       ::_M_invoke;
          local_58 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer_manager.cpp:68:17)>
                     ::_M_manager;
          thread_pool::push(&this->m_pool,(task_t *)&local_68);
          std::_Function_base::~_Function_base((_Function_base *)&local_68);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_88._M_refcount);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    (&weak_context.
                      super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  return;
}

Assistant:

void timer_manager::loop() {
	// loop
	while (m_thread_active) {
		std::unique_lock<std::mutex> lock(m_mutex);
		auto itr{ m_active_timers.begin() };
		if (itr != m_active_timers.end()) {
			// Wait until the next timer is ready to fire
			if (m_cvar.wait_until(lock, (*itr)->next()) == std::cv_status::timeout
				&& !m_active_timers.empty() && itr == m_active_timers.begin() && itr != m_active_timers.end()) {

				// Due to a race condition, we may still receive timeout when another thread has notified m_cvar too late
				// Notifying the thread before releasing the lock does not resolve this, because wait_until's return
				// status may be based entirely on the time of return and the input time (as is the case in GCC 7.2)
				if (!is_timeout) {
					// itr may be invalidated; restart wait
					is_timeout = true;
					continue;
				}

				timer_context* context = *itr;

				// Reset timings
				m_active_timers.erase(itr);
				context->m_next = context->calc_next();
				m_active_timers.insert(context);

				// Push timer to execute
				std::weak_ptr<timer_context> weak_context = context->weak_from_this();
				m_pool.push([weak_context]() {
					if (auto context = weak_context.lock()) {
						// Execute timer
						// Locking will only fail when the timer is in the process of being cancelled
						std::shared_lock<std::shared_mutex> context_guard{ context->m_mutex, std::try_to_lock };
						if (context_guard.owns_lock() && !context->null()) {
							timer& callback_timer{thread_callback_timer()};
							callback_timer.m_context = context;

							// Call callback
							context->m_callback(callback_timer);

							// Release timer context
							callback_timer.m_context = nullptr;
						}
					}
				});
			}
			// else // m_active_timers changed; itr may be invalid; itr may not be the next timer
		}
		else {
			// Wait until a timer is added
			m_cvar.wait(lock);
		}
	}
}